

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_1,_false,_embree::sse2::SubGridIntersector1Moeller<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint *puVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [13];
  undefined1 auVar29 [13];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [14];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 (*pauVar39) [16];
  long lVar40;
  Scene *pSVar41;
  RayHit *pRVar43;
  int iVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  undefined4 uVar47;
  ulong uVar48;
  Geometry *pGVar49;
  ulong uVar50;
  long lVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  RTCRayQueryContext *pRVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  float fVar62;
  float fVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar89;
  float fVar90;
  vint<4> sy;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  float fVar114;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar115;
  float fVar116;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar132 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  byte bVar166;
  char cVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  byte bVar184;
  char cVar185;
  byte bVar186;
  char cVar187;
  char cVar188;
  char cVar189;
  float fVar190;
  float fVar191;
  char cVar192;
  char cVar193;
  byte bVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar174 [16];
  undefined1 auVar181 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  uint uVar201;
  float fVar202;
  uint uVar203;
  float fVar204;
  uint uVar205;
  float fVar206;
  uint uVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vint<4> sx;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1334 [12];
  undefined1 local_1328 [4];
  undefined1 auStack_1324 [8];
  float fStack_131c;
  undefined8 local_1318;
  float fStack_1310;
  float fStack_130c;
  undefined8 local_1308;
  undefined8 local_1300;
  undefined8 local_12f8;
  float fStack_12f0;
  float fStack_12ec;
  uint auStack_12e8 [1];
  uint auStack_12e4 [1];
  ulong local_12e0;
  undefined8 local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  undefined8 local_12c8;
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  undefined8 uStack_12a0;
  undefined1 local_1298 [16];
  RTCFilterFunctionNArguments local_1288;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  undefined4 local_1244;
  undefined4 local_1240;
  float local_123c;
  float local_1238;
  undefined4 local_1234;
  undefined4 local_1230;
  uint local_122c;
  uint local_1228;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  long local_11f0;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [8];
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [16];
  undefined1 local_1148 [16];
  float local_1138 [4];
  float local_1128 [4];
  float local_1118 [4];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  ulong local_10d0;
  ulong local_10c8;
  ulong local_10c0;
  ulong local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  ulong local_10a0;
  ulong local_1098;
  ulong local_1090;
  ulong local_1088;
  ulong local_1080;
  long local_1078;
  long local_1070;
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar42;
  undefined1 auVar175 [16];
  undefined1 auVar171 [11];
  undefined1 auVar176 [16];
  undefined1 auVar182 [16];
  undefined1 auVar172 [12];
  undefined1 auVar177 [16];
  undefined1 auVar173 [13];
  undefined1 auVar178 [16];
  undefined1 auVar183 [16];
  undefined1 auVar180 [16];
  undefined1 auVar179 [16];
  undefined2 uVar194;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar52 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar89 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar90 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar100 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar146 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar154 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar101 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar115 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar170 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar73 = 0.0;
    if (0.0 <= fVar146) {
      fVar73 = fVar146;
    }
    fVar146 = (ray->super_RayK<1>).tfar;
    fVar62 = 0.0;
    if (0.0 <= fVar146) {
      fVar62 = fVar146;
    }
    uVar58 = -(uint)((float)DAT_01f4bd50 <= ABS(fVar154));
    uVar59 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar101));
    uVar60 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(fVar115));
    uVar61 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar170));
    auVar63._0_4_ = (uint)fVar154 & uVar58;
    auVar63._4_4_ = (uint)fVar101 & uVar59;
    auVar63._8_4_ = (uint)fVar115 & uVar60;
    auVar63._12_4_ = (uint)fVar170 & uVar61;
    auVar91._0_4_ = ~uVar58 & (uint)(float)DAT_01f4bd50;
    auVar91._4_4_ = ~uVar59 & (uint)DAT_01f4bd50._4_4_;
    auVar91._8_4_ = ~uVar60 & (uint)DAT_01f4bd50._8_4_;
    auVar91._12_4_ = ~uVar61 & (uint)DAT_01f4bd50._12_4_;
    auVar91 = auVar91 | auVar63;
    auVar74 = rcpps(auVar63,auVar91);
    fVar155 = auVar74._0_4_;
    fVar157 = auVar74._4_4_;
    fVar159 = auVar74._8_4_;
    fVar155 = (1.0 - auVar91._0_4_ * fVar155) * fVar155 + fVar155;
    fVar157 = (1.0 - auVar91._4_4_ * fVar157) * fVar157 + fVar157;
    fVar159 = (1.0 - auVar91._8_4_ * fVar159) * fVar159 + fVar159;
    uVar42 = (ulong)(fVar155 < 0.0) << 4;
    uVar54 = (ulong)(fVar157 < 0.0) << 4 | 0x20;
    uVar56 = (ulong)(fVar159 < 0.0) << 4 | 0x40;
    uVar53 = uVar42 ^ 0x10;
    uVar48 = uVar54 ^ 0x10;
    uVar50 = uVar56 ^ 0x10;
    auVar74._4_4_ = fVar73;
    auVar74._0_4_ = fVar73;
    auVar74._8_4_ = fVar73;
    auVar74._12_4_ = fVar73;
    local_10a8 = (ulong)(((uint)(fVar155 < 0.0) << 4) >> 2);
    local_10b0 = uVar53 >> 2;
    local_10b8 = uVar54 >> 2;
    local_10c0 = uVar48 >> 2;
    local_10c8 = uVar56 >> 2;
    local_10d0 = uVar50 >> 2;
    _local_1048 = mm_lookupmask_ps._240_8_;
    _uStack_1040 = mm_lookupmask_ps._248_8_;
    local_1308 = context;
    local_1300 = ray;
    local_ff8 = fVar100;
    fStack_ff4 = fVar100;
    fStack_ff0 = fVar100;
    fStack_fec = fVar100;
    local_1068 = auVar74;
    local_1058 = fVar159;
    fStack_1054 = fVar159;
    fStack_1050 = fVar159;
    fStack_104c = fVar159;
    local_1008 = fVar89;
    fStack_1004 = fVar89;
    fStack_1000 = fVar89;
    fStack_ffc = fVar89;
    local_1018 = fVar90;
    fStack_1014 = fVar90;
    fStack_1010 = fVar90;
    fStack_100c = fVar90;
    local_1080 = uVar42;
    local_1028 = fVar155;
    fStack_1024 = fVar155;
    fStack_1020 = fVar155;
    fStack_101c = fVar155;
    local_1038 = fVar157;
    fStack_1034 = fVar157;
    fStack_1030 = fVar157;
    fStack_102c = fVar157;
    local_1088 = uVar54;
    local_1090 = uVar56;
    local_1098 = uVar53;
    local_10a0 = uVar48;
    fVar73 = fVar89;
    fVar146 = fVar89;
    fVar154 = fVar89;
    fVar101 = fVar90;
    fVar115 = fVar90;
    fVar170 = fVar90;
    fVar71 = fVar159;
    fVar72 = fVar159;
    fVar114 = fVar159;
    fVar116 = fVar155;
    fVar131 = fVar155;
    fVar133 = fVar155;
    fVar134 = fVar62;
    fVar135 = fVar62;
    fVar136 = fVar62;
    fVar137 = fVar157;
    fVar141 = fVar157;
    fVar142 = fVar157;
    fVar143 = fVar100;
    fVar144 = fVar100;
    fVar145 = fVar100;
LAB_0059f8d0:
    if (pauVar52 != (undefined1 (*) [16])&local_f78) {
      pauVar39 = pauVar52 + -1;
      pauVar52 = pauVar52 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar39 + 8) < *pfVar1 || *(float *)((long)*pauVar39 + 8) == *pfVar1) {
        pauVar39 = (undefined1 (*) [16])&local_f78;
        pauVar45 = *(undefined1 (**) [16])*pauVar52;
        while (((ulong)pauVar45 & 8) == 0) {
          pfVar1 = (float *)((long)pauVar45[2] + uVar42);
          auVar93._0_4_ = (*pfVar1 - fVar89) * fVar155;
          auVar93._4_4_ = (pfVar1[1] - fVar73) * fVar116;
          auVar93._8_4_ = (pfVar1[2] - fVar146) * fVar131;
          auVar93._12_4_ = (pfVar1[3] - fVar154) * fVar133;
          pfVar1 = (float *)((long)pauVar45[2] + uVar54);
          auVar75._0_4_ = (*pfVar1 - fVar90) * fVar157;
          auVar75._4_4_ = (pfVar1[1] - fVar101) * fVar137;
          auVar75._8_4_ = (pfVar1[2] - fVar115) * fVar141;
          auVar75._12_4_ = (pfVar1[3] - fVar170) * fVar142;
          auVar63 = maxps(auVar93,auVar75);
          pfVar1 = (float *)((long)pauVar45[2] + uVar56);
          auVar76._0_4_ = (*pfVar1 - fVar100) * fVar159;
          auVar76._4_4_ = (pfVar1[1] - fVar143) * fVar71;
          auVar76._8_4_ = (pfVar1[2] - fVar144) * fVar72;
          auVar76._12_4_ = (pfVar1[3] - fVar145) * fVar114;
          pfVar1 = (float *)((long)pauVar45[2] + uVar53);
          auVar92._0_4_ = (*pfVar1 - fVar89) * fVar155;
          auVar92._4_4_ = (pfVar1[1] - fVar73) * fVar116;
          auVar92._8_4_ = (pfVar1[2] - fVar146) * fVar131;
          auVar92._12_4_ = (pfVar1[3] - fVar154) * fVar133;
          pfVar1 = (float *)((long)pauVar45[2] + uVar48);
          auVar102._0_4_ = (*pfVar1 - fVar90) * fVar157;
          auVar102._4_4_ = (pfVar1[1] - fVar101) * fVar137;
          auVar102._8_4_ = (pfVar1[2] - fVar115) * fVar141;
          auVar102._12_4_ = (pfVar1[3] - fVar170) * fVar142;
          auVar93 = minps(auVar92,auVar102);
          pfVar1 = (float *)((long)pauVar45[2] + uVar50);
          auVar103._0_4_ = (*pfVar1 - fVar100) * fVar159;
          auVar103._4_4_ = (pfVar1[1] - fVar143) * fVar71;
          auVar103._8_4_ = (pfVar1[2] - fVar144) * fVar72;
          auVar103._12_4_ = (pfVar1[3] - fVar145) * fVar114;
          auVar91 = maxps(auVar76,auVar74);
          _local_1198 = maxps(auVar63,auVar91);
          auVar107._4_4_ = fVar134;
          auVar107._0_4_ = fVar62;
          auVar107._8_4_ = fVar135;
          auVar107._12_4_ = fVar136;
          auVar63 = minps(auVar103,auVar107);
          auVar63 = minps(auVar93,auVar63);
          auVar125._4_4_ = -(uint)(local_1198._4_4_ <= auVar63._4_4_);
          auVar125._0_4_ = -(uint)(local_1198._0_4_ <= auVar63._0_4_);
          auVar125._8_4_ = -(uint)(local_1198._8_4_ <= auVar63._8_4_);
          auVar125._12_4_ = -(uint)(local_1198._12_4_ <= auVar63._12_4_);
          uVar58 = movmskps((int)pauVar39,auVar125);
          if (uVar58 == 0) goto LAB_0059f8d0;
          uVar58 = uVar58 & 0xff;
          uVar46 = (ulong)pauVar45 & 0xfffffffffffffff0;
          lVar10 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          pauVar39 = *(undefined1 (**) [16])(uVar46 + lVar10 * 8);
          uVar58 = uVar58 - 1 & uVar58;
          pauVar45 = pauVar39;
          if (uVar58 != 0) {
            uVar59 = *(uint *)(local_1198 + lVar10 * 4);
            lVar10 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            pauVar45 = *(undefined1 (**) [16])(uVar46 + lVar10 * 8);
            uVar60 = *(uint *)(local_1198 + lVar10 * 4);
            uVar58 = uVar58 - 1 & uVar58;
            if (uVar58 == 0) {
              if (uVar59 < uVar60) {
                *(undefined1 (**) [16])*pauVar52 = pauVar45;
                *(uint *)((long)*pauVar52 + 8) = uVar60;
                pauVar45 = pauVar39;
                pauVar52 = pauVar52 + 1;
              }
              else {
                *(undefined1 (**) [16])*pauVar52 = pauVar39;
                *(uint *)((long)*pauVar52 + 8) = uVar59;
                pauVar39 = pauVar45;
                pauVar52 = pauVar52 + 1;
              }
            }
            else {
              auVar64._8_4_ = uVar59;
              auVar64._0_8_ = pauVar39;
              auVar64._12_4_ = 0;
              auVar77._8_4_ = uVar60;
              auVar77._0_8_ = pauVar45;
              auVar77._12_4_ = 0;
              lVar10 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar7 = *(ulong *)(uVar46 + lVar10 * 8);
              iVar44 = *(int *)(local_1198 + lVar10 * 4);
              auVar94._8_4_ = iVar44;
              auVar94._0_8_ = uVar7;
              auVar94._12_4_ = 0;
              auVar104._8_4_ = -(uint)((int)uVar59 < (int)uVar60);
              uVar58 = uVar58 - 1 & uVar58;
              if (uVar58 == 0) {
                auVar104._4_4_ = auVar104._8_4_;
                auVar104._0_4_ = auVar104._8_4_;
                auVar104._12_4_ = auVar104._8_4_;
                auVar63 = auVar64 & auVar104 | ~auVar104 & auVar77;
                auVar91 = auVar77 & auVar104 | ~auVar104 & auVar64;
                auVar105._8_4_ = -(uint)(auVar63._8_4_ < iVar44);
                auVar105._0_8_ = CONCAT44(auVar105._8_4_,auVar105._8_4_);
                auVar105._12_4_ = auVar105._8_4_;
                pauVar39 = (undefined1 (*) [16])
                           (~auVar105._0_8_ & uVar7 | auVar63._0_8_ & auVar105._0_8_);
                auVar63 = auVar94 & auVar105 | ~auVar105 & auVar63;
                auVar65._8_4_ = -(uint)(auVar91._8_4_ < auVar63._8_4_);
                auVar65._4_4_ = auVar65._8_4_;
                auVar65._0_4_ = auVar65._8_4_;
                auVar65._12_4_ = auVar65._8_4_;
                *pauVar52 = ~auVar65 & auVar91 | auVar63 & auVar65;
                pauVar52[1] = auVar91 & auVar65 | ~auVar65 & auVar63;
                pauVar52 = pauVar52 + 2;
                pauVar45 = pauVar39;
              }
              else {
                lVar10 = 0;
                if (uVar58 != 0) {
                  for (; (uVar58 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                iVar6 = *(int *)(local_1198 + lVar10 * 4);
                auVar117._8_4_ = iVar6;
                auVar117._0_8_ = *(undefined8 *)(uVar46 + lVar10 * 8);
                auVar117._12_4_ = 0;
                auVar106._4_4_ = auVar104._8_4_;
                auVar106._0_4_ = auVar104._8_4_;
                auVar106._8_4_ = auVar104._8_4_;
                auVar106._12_4_ = auVar104._8_4_;
                auVar63 = auVar64 & auVar106 | ~auVar106 & auVar77;
                auVar91 = auVar77 & auVar106 | ~auVar106 & auVar64;
                auVar124._0_4_ = -(uint)(iVar44 < iVar6);
                auVar124._4_4_ = -(uint)(iVar44 < iVar6);
                auVar124._8_4_ = -(uint)(iVar44 < iVar6);
                auVar124._12_4_ = -(uint)(iVar44 < iVar6);
                auVar107 = auVar94 & auVar124 | ~auVar124 & auVar117;
                auVar125 = ~auVar124 & auVar94 | auVar117 & auVar124;
                auVar95._8_4_ = -(uint)(auVar91._8_4_ < auVar125._8_4_);
                auVar95._4_4_ = auVar95._8_4_;
                auVar95._0_4_ = auVar95._8_4_;
                auVar95._12_4_ = auVar95._8_4_;
                auVar93 = auVar91 & auVar95 | ~auVar95 & auVar125;
                auVar78._8_4_ = -(uint)(auVar63._8_4_ < auVar107._8_4_);
                auVar78._0_8_ = CONCAT44(auVar78._8_4_,auVar78._8_4_);
                auVar78._12_4_ = auVar78._8_4_;
                pauVar39 = (undefined1 (*) [16])
                           (auVar63._0_8_ & auVar78._0_8_ | ~auVar78._0_8_ & auVar107._0_8_);
                auVar63 = ~auVar78 & auVar63 | auVar107 & auVar78;
                auVar66._8_4_ = -(uint)(auVar63._8_4_ < auVar93._8_4_);
                auVar66._4_4_ = auVar66._8_4_;
                auVar66._0_4_ = auVar66._8_4_;
                auVar66._12_4_ = auVar66._8_4_;
                *pauVar52 = ~auVar95 & auVar91 | auVar125 & auVar95;
                pauVar52[1] = ~auVar66 & auVar63 | auVar93 & auVar66;
                pauVar52[2] = auVar63 & auVar66 | ~auVar66 & auVar93;
                pauVar52 = pauVar52 + 3;
                pauVar45 = pauVar39;
              }
            }
          }
        }
        local_1078 = (ulong)((uint)pauVar45 & 0xf) - 8;
        uVar46 = (ulong)pauVar45 & 0xfffffffffffffff0;
        local_f98 = fVar62;
        fStack_f94 = fVar134;
        fStack_f90 = fVar135;
        fStack_f8c = fVar136;
        for (local_1070 = 0; local_1070 != local_1078; local_1070 = local_1070 + 1) {
          lVar40 = local_1070 * 0x58;
          lVar10 = uVar46 + lVar40;
          uVar5 = *(undefined8 *)(uVar46 + 0x20 + lVar40);
          uVar47 = *(undefined4 *)(uVar46 + 0x24 + lVar40);
          bVar195 = (byte)uVar5;
          bVar166 = (byte)uVar47;
          bVar11 = (byte)((ulong)uVar5 >> 8);
          bVar184 = (byte)((uint)uVar47 >> 8);
          bVar12 = (byte)((ulong)uVar5 >> 0x10);
          bVar186 = (byte)((uint)uVar47 >> 0x10);
          bVar20 = (byte)((uint)uVar47 >> 0x18);
          bVar13 = (byte)((ulong)uVar5 >> 0x18);
          cVar167 = -((byte)((bVar195 < bVar166) * bVar195 | (bVar195 >= bVar166) * bVar166) ==
                     bVar195);
          cVar185 = -((byte)((bVar11 < bVar184) * bVar11 | (bVar11 >= bVar184) * bVar184) == bVar11)
          ;
          cVar187 = -((byte)((bVar12 < bVar186) * bVar12 | (bVar12 >= bVar186) * bVar186) == bVar12)
          ;
          cVar188 = -((byte)((bVar13 < bVar20) * bVar13 | (bVar13 >= bVar20) * bVar20) == bVar13);
          cVar189 = -((char)((ulong)uVar5 >> 0x20) == '\0');
          cVar192 = -((char)((ulong)uVar5 >> 0x28) == '\0');
          cVar193 = -((char)((ulong)uVar5 >> 0x30) == '\0');
          bVar195 = -((char)((ulong)uVar5 >> 0x38) == '\0');
          auVar175._0_9_ = CONCAT18(0xff,(ulong)bVar195 << 0x38);
          auVar171._0_10_ = CONCAT19(0xff,auVar175._0_9_);
          auVar171[10] = 0xff;
          auVar172[0xb] = 0xff;
          auVar172._0_11_ = auVar171;
          auVar173[0xc] = 0xff;
          auVar173._0_12_ = auVar172;
          auVar180[0xd] = 0xff;
          auVar180._0_13_ = auVar173;
          fVar147 = *(float *)(uVar46 + 0x38 + lVar40);
          fVar148 = *(float *)(uVar46 + 0x3c + lVar40);
          fVar149 = *(float *)(uVar46 + 0x44 + lVar40);
          uVar58 = *(uint *)(local_10a8 + 0x20 + lVar10);
          auVar24[0xc] = (char)(uVar58 >> 0x18);
          auVar24._0_12_ = ZEXT712(0);
          uVar59 = *(uint *)(local_10b0 + 0x20 + lVar10);
          auVar25[0xc] = (char)(uVar59 >> 0x18);
          auVar25._0_12_ = ZEXT712(0);
          fVar150 = *(float *)(uVar46 + 0x48 + lVar40);
          uVar60 = *(uint *)(local_10b8 + 0x20 + lVar10);
          auVar26[0xc] = (char)(uVar60 >> 0x18);
          auVar26._0_12_ = ZEXT712(0);
          uVar61 = *(uint *)(local_10c0 + 0x20 + lVar10);
          auVar27[0xc] = (char)(uVar61 >> 0x18);
          auVar27._0_12_ = ZEXT712(0);
          fVar151 = *(float *)(uVar46 + 0x4c + lVar40);
          uVar201 = *(uint *)(local_10c8 + 0x20 + lVar10);
          auVar28[0xc] = (char)(uVar201 >> 0x18);
          auVar28._0_12_ = ZEXT712(0);
          uVar203 = *(uint *)(local_10d0 + 0x20 + lVar10);
          auVar29[0xc] = (char)(uVar203 >> 0x18);
          auVar29._0_12_ = ZEXT712(0);
          fVar152 = *(float *)(uVar46 + 0x40 + lVar40);
          auVar79._0_4_ = (((float)(uVar58 & 0xff) * fVar149 + fVar147) - fVar89) * fVar155;
          auVar79._4_4_ = (((float)(uVar58 >> 8 & 0xff) * fVar149 + fVar147) - fVar73) * fVar116;
          auVar79._8_4_ =
               (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar58 >> 0x10)) * fVar149 +
                fVar147) - fVar146) * fVar131;
          auVar79._12_4_ =
               (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar149 + fVar147) - fVar154) * fVar133;
          auVar118._0_4_ = (((float)(uVar60 & 0xff) * fVar150 + fVar148) - fVar90) * fVar157;
          auVar118._4_4_ = (((float)(uVar60 >> 8 & 0xff) * fVar150 + fVar148) - fVar101) * fVar137;
          auVar118._8_4_ =
               (((float)(int)CONCAT32(auVar26._10_3_,(ushort)(byte)(uVar60 >> 0x10)) * fVar150 +
                fVar148) - fVar115) * fVar141;
          auVar118._12_4_ =
               (((float)(uint3)(auVar26._10_3_ >> 0x10) * fVar150 + fVar148) - fVar170) * fVar142;
          auVar74 = maxps(auVar79,auVar118);
          auVar96._0_4_ = (((float)(uVar59 & 0xff) * fVar149 + fVar147) - fVar89) * fVar155;
          auVar96._4_4_ = (((float)(uVar59 >> 8 & 0xff) * fVar149 + fVar147) - fVar73) * fVar116;
          auVar96._8_4_ =
               (((float)(int)CONCAT32(auVar25._10_3_,(ushort)(byte)(uVar59 >> 0x10)) * fVar149 +
                fVar147) - fVar146) * fVar131;
          auVar96._12_4_ =
               (((float)(uint3)(auVar25._10_3_ >> 0x10) * fVar149 + fVar147) - fVar154) * fVar133;
          auVar108._0_4_ = (((float)(uVar61 & 0xff) * fVar150 + fVar148) - fVar90) * fVar157;
          auVar108._4_4_ = (((float)(uVar61 >> 8 & 0xff) * fVar150 + fVar148) - fVar101) * fVar137;
          auVar108._8_4_ =
               (((float)(int)CONCAT32(auVar27._10_3_,(ushort)(byte)(uVar61 >> 0x10)) * fVar150 +
                fVar148) - fVar115) * fVar141;
          auVar108._12_4_ =
               (((float)(uint3)(auVar27._10_3_ >> 0x10) * fVar150 + fVar148) - fVar170) * fVar142;
          auVar63 = minps(auVar96,auVar108);
          auVar126._0_4_ = (((float)(uVar201 & 0xff) * fVar151 + fVar152) - fVar100) * fVar159;
          auVar126._4_4_ = (((float)(uVar201 >> 8 & 0xff) * fVar151 + fVar152) - fVar143) * fVar71;
          auVar126._8_4_ =
               (((float)(int)CONCAT32(auVar28._10_3_,(ushort)(byte)(uVar201 >> 0x10)) * fVar151 +
                fVar152) - fVar144) * fVar72;
          auVar126._12_4_ =
               (((float)(uint3)(auVar28._10_3_ >> 0x10) * fVar151 + fVar152) - fVar145) * fVar114;
          auVar91 = maxps(auVar126,local_1068);
          local_f88 = maxps(auVar74,auVar91);
          auVar132._0_4_ = (((float)(uVar203 & 0xff) * fVar151 + fVar152) - fVar100) * fVar159;
          auVar132._4_4_ = (((float)(uVar203 >> 8 & 0xff) * fVar151 + fVar152) - fVar143) * fVar71;
          auVar132._8_4_ =
               (((float)(int)CONCAT32(auVar29._10_3_,(ushort)(byte)(uVar203 >> 0x10)) * fVar151 +
                fVar152) - fVar144) * fVar72;
          auVar132._12_4_ =
               (((float)(uint3)(auVar29._10_3_ >> 0x10) * fVar151 + fVar152) - fVar145) * fVar114;
          auVar18._4_4_ = fVar134;
          auVar18._0_4_ = fVar62;
          auVar18._8_4_ = fVar135;
          auVar18._12_4_ = fVar136;
          auVar74 = minps(auVar132,auVar18);
          auVar74 = minps(auVar63,auVar74);
          auVar180[0xe] = bVar195;
          auVar180[0xf] = bVar195;
          auVar179._14_2_ = auVar180._14_2_;
          auVar179[0xd] = cVar193;
          auVar179._0_13_ = auVar173;
          auVar178._13_3_ = auVar179._13_3_;
          auVar178[0xc] = cVar193;
          auVar178._0_12_ = auVar172;
          auVar177._12_4_ = auVar178._12_4_;
          auVar177[0xb] = cVar192;
          auVar177._0_11_ = auVar171;
          auVar176._11_5_ = auVar177._11_5_;
          auVar176[10] = cVar192;
          auVar176._0_10_ = auVar171._0_10_;
          auVar175._10_6_ = auVar176._10_6_;
          auVar175[9] = cVar189;
          Var32 = CONCAT91(CONCAT81((long)(CONCAT72(auVar175._9_7_,CONCAT11(cVar189,bVar195)) >> 8),
                                    cVar188),cVar188);
          auVar31._2_10_ = Var32;
          auVar31[1] = cVar187;
          auVar31[0] = cVar187;
          auVar30._2_12_ = auVar31;
          auVar30[1] = cVar185;
          auVar30[0] = cVar185;
          auVar174._0_2_ = CONCAT11(cVar167,cVar167);
          auVar174._2_14_ = auVar30;
          uVar194 = (undefined2)Var32;
          auVar183._0_12_ = auVar174._0_12_;
          auVar183._12_2_ = uVar194;
          auVar183._14_2_ = uVar194;
          auVar182._12_4_ = auVar183._12_4_;
          auVar182._0_10_ = auVar174._0_10_;
          auVar182._10_2_ = auVar31._0_2_;
          auVar181._10_6_ = auVar182._10_6_;
          auVar181._0_8_ = auVar174._0_8_;
          auVar181._8_2_ = auVar31._0_2_;
          auVar33._4_8_ = auVar181._8_8_;
          auVar33._2_2_ = auVar30._0_2_;
          auVar33._0_2_ = auVar30._0_2_;
          uVar58 = CONCAT22(auVar174._0_2_,auVar174._0_2_);
          auVar80._0_4_ = -(uint)(local_f88._0_4_ <= auVar74._0_4_) & uVar58;
          auVar80._4_4_ = -(uint)(local_f88._4_4_ <= auVar74._4_4_) & auVar33._0_4_;
          auVar80._8_4_ = -(uint)(local_f88._8_4_ <= auVar74._8_4_) & auVar181._8_4_;
          auVar80._12_4_ = -(uint)(local_f88._12_4_ <= auVar74._12_4_) & auVar182._12_4_;
          uVar47 = movmskps((int)uVar48,auVar80);
          uVar48 = CONCAT44((int)(uVar48 >> 0x20),uVar47);
LAB_0059fdfb:
          if (uVar48 != 0) {
            lVar40 = 0;
            if (uVar48 != 0) {
              for (; (uVar48 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            uVar48 = uVar48 & uVar48 - 1;
            fVar73 = (ray->super_RayK<1>).tfar;
            if (*(float *)(local_f88 + lVar40 * 4) <= fVar73) {
              local_fa8 = ZEXT416((uint)fVar73);
              fVar89 = *(float *)(lVar10 + 0x50);
              local_1334._4_8_ = ZEXT48((uint)fVar89);
              fVar90 = *(float *)(lVar10 + 4 + lVar40 * 8);
              pSVar41 = local_1308->scene;
              pGVar49 = (pSVar41->geometries).items[local_1334._4_8_].ptr;
              local_11f0 = *(long *)&pGVar49->field_0x58;
              lVar8 = *(long *)&pGVar49[1].time_range.upper;
              local_12e0 = (ulong)(uint)fVar90;
              lVar55 = (ulong)(uint)fVar90 *
                       pGVar49[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              uVar42 = *(ulong *)(lVar10 + lVar40 * 8);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar42;
              auVar67 = auVar67 & _DAT_01f76ac0;
              auVar21._10_2_ = 0;
              auVar21._0_10_ = auVar67._0_10_;
              auVar21._12_2_ = auVar67._6_2_;
              auVar22._8_2_ = auVar67._4_2_;
              auVar22._0_8_ = auVar67._0_8_;
              auVar22._10_4_ = auVar21._10_4_;
              auVar34._6_8_ = 0;
              auVar34._0_6_ = auVar22._8_6_;
              auVar23._4_2_ = auVar67._2_2_;
              auVar23._0_4_ = auVar67._0_4_;
              auVar23._6_8_ = SUB148(auVar34 << 0x40,6);
              local_fe8 = (uint)auVar67._0_2_;
              uVar53 = *(ulong *)(local_11f0 + lVar55);
              uVar54 = (ulong)((int)((ulong)(auVar67._0_4_ >> 0x10) * (uVar53 >> 0x20)) +
                              (int)uVar53 + local_fe8);
              p_Var9 = pGVar49[1].intersectionFilterN;
              pfVar1 = (float *)(lVar8 + (long)p_Var9 * uVar54);
              fVar100 = *pfVar1;
              local_fc8 = pfVar1[1];
              fVar146 = pfVar1[2];
              pfVar1 = (float *)(lVar8 + (uVar54 + 1) * (long)p_Var9);
              local_1318._0_4_ = *pfVar1;
              fStack_fc4 = pfVar1[1];
              local_12a8._0_4_ = pfVar1[2];
              uVar53 = uVar53 >> 0x20;
              lVar40 = uVar54 + uVar53 + 1;
              pfVar1 = (float *)(lVar8 + (uVar54 + uVar53) * (long)p_Var9);
              local_1258._0_4_ = *pfVar1;
              fStack_fbc = pfVar1[1];
              fVar154 = pfVar1[2];
              pfVar1 = (float *)(lVar8 + lVar40 * (long)p_Var9);
              local_12f8._0_4_ = *pfVar1;
              local_1218 = pfVar1[1];
              local_1328 = (undefined1  [4])pfVar1[2];
              uVar56 = (ulong)(-1 < (short)uVar42);
              pfVar1 = (float *)(lVar8 + (uVar54 + uVar56 + 1) * (long)p_Var9);
              local_1318._4_4_ = *pfVar1;
              lVar51 = uVar56 + lVar40;
              pfVar2 = (float *)(lVar8 + lVar51 * (long)p_Var9);
              local_12f8._4_4_ = *pfVar2;
              fStack_1214 = pfVar2[1];
              auStack_1324._0_4_ = pfVar2[2];
              uVar56 = 0;
              if (-1 < (short)(uVar42 >> 0x10)) {
                uVar56 = uVar53;
              }
              pfVar2 = (float *)(lVar8 + (uVar54 + uVar53 + uVar56) * (long)p_Var9);
              pfVar3 = (float *)(lVar8 + (lVar40 + uVar56) * (long)p_Var9);
              auStack_12e4[0] = (uint)*pfVar3;
              fStack_120c = pfVar3[1];
              fStack_131c = pfVar3[2];
              puVar4 = (uint *)(lVar8 + (uVar56 + lVar51) * (long)p_Var9);
              auStack_1324._4_4_ = puVar4[2];
              local_1308 = (RayQueryContext *)CONCAT44((float)local_12f8,local_12f8._4_4_);
              auStack_12e8[0] = *puVar4;
              fStack_1210 = (float)puVar4[1];
              fStack_11a0 = fStack_1214;
              fStack_119c = local_1218;
              fVar62 = local_fc8 - fStack_fc4;
              fVar159 = fStack_fc4 - pfVar1[1];
              fVar71 = local_1218 - fStack_1214;
              fVar72 = fStack_fbc - local_1218;
              local_12a8._4_4_ = pfVar1[2];
              uStack_12a0._0_4_ = (float)auStack_1324._0_4_;
              uStack_12a0._4_4_ = (float)local_1328;
              fVar168 = fVar146 - (float)local_12a8._0_4_;
              fVar190 = (float)local_12a8._0_4_ - pfVar1[2];
              fVar196 = (float)local_1328 - (float)auStack_1324._0_4_;
              fVar198 = fVar154 - (float)local_1328;
              fStack_11c0 = fStack_120c;
              fStack_11bc = pfVar2[1];
              fVar200 = fStack_fbc - local_fc8;
              fVar202 = local_1218 - fStack_fc4;
              fVar204 = fStack_120c - local_1218;
              fVar206 = pfVar2[1] - fStack_fbc;
              local_11b8 = CONCAT44(local_1328,fVar154);
              local_11a8 = fStack_131c;
              fStack_11a4 = pfVar2[2];
              fVar131 = fVar154 - fVar146;
              fVar133 = (float)local_1328 - (float)local_12a8._0_4_;
              fVar134 = fStack_131c - (float)local_1328;
              fVar135 = pfVar2[2] - fVar154;
              fVar136 = fVar168 * fVar200 - fVar62 * fVar131;
              fVar141 = fVar190 * fVar202 - fVar159 * fVar133;
              fVar157 = fVar196 * fVar204 - fVar71 * fVar134;
              fVar144 = fVar198 * fVar206 - fVar72 * fVar135;
              local_11d8 = CONCAT44((float)local_12f8,local_1258._0_4_);
              local_11c8 = (float)auStack_12e4[0];
              fStack_11c4 = *pfVar2;
              fVar162 = (float)local_1258._0_4_ - fVar100;
              fVar163 = (float)local_12f8 - (float)(undefined4)local_1318;
              fVar164 = (float)auStack_12e4[0] - (float)local_12f8;
              fVar165 = *pfVar2 - (float)local_1258._0_4_;
              fVar101 = *(float *)local_1300;
              local_12c8._0_4_ = *(float *)(local_1300 + 4);
              fVar115 = *(float *)(local_1300 + 8);
              fVar170 = (((Vec3ff *)(local_1300 + 0x10))->field_0).m128[0];
              local_1208 = *(float *)(local_1300 + 0x14);
              local_12b8._4_4_ = *(float *)(local_1300 + 0x18);
              local_11e8 = fVar101;
              fStack_11e4 = fVar101;
              fStack_11e0 = fVar101;
              fStack_11dc = fVar101;
              local_fb8 = fVar100 - fVar101;
              fStack_fb4 = (float)(undefined4)local_1318 - fVar101;
              fStack_fb0 = (float)local_12f8 - fVar101;
              fStack_fac = (float)local_1258._0_4_ - fVar101;
              local_12c8._4_4_ = (float)local_12c8;
              fStack_12c0 = (float)local_12c8;
              fStack_12bc = (float)local_12c8;
              local_fc8 = local_fc8 - (float)local_12c8;
              fStack_fc4 = fStack_fc4 - (float)local_12c8;
              fStack_fc0 = local_1218 - (float)local_12c8;
              fStack_fbc = fStack_fbc - (float)local_12c8;
              fVar156 = local_fb8 * local_1208 - local_fc8 * fVar170;
              fVar158 = fStack_fb4 * local_1208 - fStack_fc4 * fVar170;
              fVar160 = fStack_fb0 * local_1208 - fStack_fc0 * fVar170;
              fVar161 = fStack_fac * local_1208 - fStack_fbc * fVar170;
              fVar100 = fVar100 - (float)(undefined4)local_1318;
              fVar114 = (float)(undefined4)local_1318 - local_1318._4_4_;
              fVar155 = (float)local_12f8 - fStack_1310;
              fVar116 = (float)local_1258._0_4_ - fStack_130c;
              local_10f8._0_4_ = fVar100 * fVar131 - fVar168 * fVar162;
              local_10f8._4_4_ = fVar114 * fVar133 - fVar190 * fVar163;
              local_10f8._8_4_ = fVar155 * fVar134 - fVar196 * fVar164;
              local_10f8._12_4_ = fVar116 * fVar135 - fVar198 * fVar165;
              local_12d8 = (Geometry *)CONCAT44(fVar115,fVar115);
              fStack_12d0 = fVar115;
              fStack_12cc = fVar115;
              fVar146 = fVar146 - fVar115;
              fVar148 = (float)local_12a8._0_4_ - fVar115;
              fVar150 = (float)local_1328 - fVar115;
              fVar152 = fVar154 - fVar115;
              fVar147 = fVar146 * fVar170 - local_fb8 * (float)local_12b8._4_4_;
              fVar149 = fVar148 * fVar170 - fStack_fb4 * (float)local_12b8._4_4_;
              fVar151 = fVar150 * fVar170 - fStack_fb0 * (float)local_12b8._4_4_;
              fVar153 = fVar152 * fVar170 - fStack_fac * (float)local_12b8._4_4_;
              fVar169 = fVar62 * fVar162 - fVar100 * fVar200;
              fVar191 = fVar159 * fVar163 - fVar114 * fVar202;
              fVar197 = fVar71 * fVar164 - fVar155 * fVar204;
              fVar199 = fVar72 * fVar165 - fVar116 * fVar206;
              fVar210 = local_fc8 * (float)local_12b8._4_4_ - fVar146 * local_1208;
              fVar211 = fStack_fc4 * (float)local_12b8._4_4_ - fVar148 * local_1208;
              fVar212 = fStack_fc0 * (float)local_12b8._4_4_ - fVar150 * local_1208;
              fVar213 = fStack_fbc * (float)local_12b8._4_4_ - fVar152 * local_1208;
              local_12b8._0_4_ = local_12b8._4_4_;
              fStack_12b0 = (float)local_12b8._4_4_;
              fStack_12ac = (float)local_12b8._4_4_;
              fStack_1204 = local_1208;
              fStack_1200 = local_1208;
              fStack_11fc = local_1208;
              fVar137 = fVar136 * fVar170 +
                        (float)local_10f8._0_4_ * local_1208 + fVar169 * (float)local_12b8._4_4_;
              fVar142 = fVar141 * fVar170 +
                        (float)local_10f8._4_4_ * local_1208 + fVar191 * (float)local_12b8._4_4_;
              fVar143 = fVar157 * fVar170 +
                        (float)local_10f8._8_4_ * local_1208 + fVar197 * (float)local_12b8._4_4_;
              fVar145 = fVar144 * fVar170 +
                        (float)local_10f8._12_4_ * local_1208 + fVar199 * (float)local_12b8._4_4_;
              uVar201 = (uint)fVar137 & 0x80000000;
              uVar203 = (uint)fVar142 & 0x80000000;
              uVar205 = (uint)fVar143 & 0x80000000;
              uVar207 = (uint)fVar145 & 0x80000000;
              fVar131 = (float)((uint)(fVar162 * fVar210 + fVar200 * fVar147 + fVar131 * fVar156) ^
                               uVar201);
              fVar133 = (float)((uint)(fVar163 * fVar211 + fVar202 * fVar149 + fVar133 * fVar158) ^
                               uVar203);
              fVar134 = (float)((uint)(fVar164 * fVar212 + fVar204 * fVar151 + fVar134 * fVar160) ^
                               uVar205);
              fVar135 = (float)((uint)(fVar165 * fVar213 + fVar206 * fVar153 + fVar135 * fVar161) ^
                               uVar207);
              fVar147 = (float)((uint)(fVar210 * fVar100 + fVar147 * fVar62 + fVar156 * fVar168) ^
                               uVar201);
              fVar114 = (float)((uint)(fVar211 * fVar114 + fVar149 * fVar159 + fVar158 * fVar190) ^
                               uVar203);
              fVar155 = (float)((uint)(fVar212 * fVar155 + fVar151 * fVar71 + fVar160 * fVar196) ^
                               uVar205);
              fVar72 = (float)((uint)(fVar213 * fVar116 + fVar153 * fVar72 + fVar161 * fVar198) ^
                              uVar207);
              fVar159 = ABS(fVar137);
              fVar71 = ABS(fVar142);
              local_1168._0_8_ = CONCAT44(fVar142,fVar137) & 0x7fffffff7fffffff;
              local_1168._8_4_ = ABS(fVar143);
              local_1168._12_4_ = ABS(fVar145);
              uVar58 = -(uint)((0.0 <= fVar147 && 0.0 <= fVar131) && fVar137 != 0.0) & local_1048 &
                       -(uint)(fVar131 + fVar147 <= fVar159);
              uVar59 = -(uint)((0.0 <= fVar114 && 0.0 <= fVar133) && fVar142 != 0.0) & uStack_1044 &
                       -(uint)(fVar133 + fVar114 <= fVar71);
              uVar60 = -(uint)((0.0 <= fVar155 && 0.0 <= fVar134) && fVar143 != 0.0) & uStack_1040 &
                       -(uint)(fVar134 + fVar155 <= local_1168._8_4_);
              uVar61 = -(uint)((0.0 <= fVar72 && 0.0 <= fVar135) && fVar145 != 0.0) & uStack_103c &
                       -(uint)(fVar135 + fVar72 <= local_1168._12_4_);
              auVar15._4_4_ = uVar59;
              auVar15._0_4_ = uVar58;
              auVar15._8_4_ = uVar60;
              auVar15._12_4_ = uVar61;
              iVar44 = movmskps((int)lVar8,auVar15);
              local_1258._4_4_ = auVar23._4_4_;
              local_fd8 = local_1258._4_4_;
              iStack_fd4 = local_1258._4_4_;
              iStack_fd0 = local_1258._4_4_;
              iStack_fcc = local_1258._4_4_;
              uStack_fe4 = local_fe8;
              uStack_fe0 = local_fe8;
              uStack_fdc = local_fe8;
              auVar122._4_12_ = local_10f8._4_12_;
              ray = (RayHit *)local_1300;
              fVar100 = (float)local_1328;
              fVar62 = (float)local_12f8;
              if (iVar44 != 0) {
                local_1178 = (float)(uVar201 ^
                                    (uint)(local_fb8 * fVar136 +
                                          local_fc8 * (float)local_10f8._0_4_ + fVar146 * fVar169));
                fStack_1174 = (float)(uVar203 ^
                                     (uint)(fStack_fb4 * fVar141 +
                                           fStack_fc4 * (float)local_10f8._4_4_ + fVar148 * fVar191)
                                     );
                fStack_1170 = (float)(uVar205 ^
                                     (uint)(fStack_fb0 * fVar157 +
                                           fStack_fc0 * (float)local_10f8._8_4_ + fVar150 * fVar197)
                                     );
                fStack_116c = (float)(uVar207 ^
                                     (uint)(fStack_fac * fVar144 +
                                           fStack_fbc * (float)local_10f8._12_4_ + fVar152 * fVar199
                                           ));
                fVar146 = *(float *)(local_1300 + 0xc);
                auVar138._0_4_ =
                     -(uint)(local_1178 <= fVar73 * fVar159 && fVar146 * fVar159 < local_1178) &
                     uVar58;
                auVar138._4_4_ =
                     -(uint)(fStack_1174 <= fVar73 * fVar71 && fVar146 * fVar71 < fStack_1174) &
                     uVar59;
                auVar138._8_4_ =
                     -(uint)(fStack_1170 <= fVar73 * local_1168._8_4_ &&
                            fVar146 * local_1168._8_4_ < fStack_1170) & uVar60;
                auVar138._12_4_ =
                     -(uint)(fStack_116c <= fVar73 * local_1168._12_4_ &&
                            fVar146 * local_1168._12_4_ < fStack_116c) & uVar61;
                iVar44 = movmskps(iVar44,auVar138);
                if (iVar44 != 0) {
                  local_1148 = auVar138;
                  local_1108 = CONCAT44(fVar141,fVar136);
                  uStack_1100 = CONCAT44(fVar144,fVar157);
                  local_10e8 = CONCAT44(fVar191,fVar169);
                  uStack_10e0 = CONCAT44(fVar199,fVar197);
                  auVar122._0_4_ = (float)(int)(*(ushort *)(local_11f0 + 8 + lVar55) - 1);
                  auVar208._4_4_ = local_10f8._4_4_;
                  auVar208._0_4_ = auVar122._0_4_;
                  auVar208._8_4_ = local_10f8._8_4_;
                  auVar208._12_4_ = local_10f8._12_4_;
                  auVar74 = rcpss(auVar208,auVar122);
                  fVar73 = (float)(int)(*(ushort *)(local_11f0 + 10 + lVar55) - 1);
                  fStack_118c = (2.0 - auVar122._0_4_ * auVar74._0_4_) * auVar74._0_4_;
                  auVar209._4_4_ = uVar59;
                  auVar209._0_4_ = fVar73;
                  auVar209._8_4_ = uVar60;
                  auVar209._12_4_ = uVar61;
                  auVar16._4_4_ = uVar59;
                  auVar16._0_4_ = fVar73;
                  auVar16._8_4_ = uVar60;
                  auVar16._12_4_ = uVar61;
                  auVar74 = rcpss(auVar209,auVar16);
                  fVar146 = (2.0 - fVar73 * auVar74._0_4_) * auVar74._0_4_;
                  local_1198._0_4_ = fStack_118c * ((float)local_fe8 * fVar159 + fVar131);
                  local_1198._4_4_ = fStack_118c * ((float)(local_fe8 + 1) * fVar71 + fVar133);
                  fStack_1190 = fStack_118c * ((float)(local_fe8 + 1) * local_1168._8_4_ + fVar134);
                  fStack_118c = fStack_118c * ((float)local_fe8 * local_1168._12_4_ + fVar135);
                  auVar128._0_4_ = (float)local_1258._4_4_ * fVar159 + fVar147;
                  auVar128._4_4_ = (float)local_1258._4_4_ * fVar71 + fVar114;
                  auVar128._8_4_ = (float)(local_1258._4_4_ + 1) * local_1168._8_4_ + fVar155;
                  auVar128._12_4_ = (float)(local_1258._4_4_ + 1) * local_1168._12_4_ + fVar72;
                  local_1188._4_4_ = fVar146 * auVar128._4_4_;
                  local_1188._0_4_ = fVar146 * auVar128._0_4_;
                  fStack_1180 = fVar146 * auVar128._8_4_;
                  fStack_117c = fVar146 * auVar128._12_4_;
                  pGVar49 = (pSVar41->geometries).items[local_1334._4_8_].ptr;
                  fVar73 = *(float *)(local_1300 + 0x24);
                  pSVar41 = (Scene *)(ulong)(uint)fVar73;
                  if ((pGVar49->mask & (uint)fVar73) != 0) {
                    local_1298 = auVar138;
                    auVar74 = rcpps(auVar128,local_1168);
                    fVar72 = auVar74._0_4_;
                    fVar114 = auVar74._4_4_;
                    fVar155 = auVar74._8_4_;
                    fVar116 = auVar74._12_4_;
                    fVar72 = (1.0 - fVar159 * fVar72) * fVar72 + fVar72;
                    fVar114 = (1.0 - fVar71 * fVar114) * fVar114 + fVar114;
                    fVar155 = (1.0 - local_1168._8_4_ * fVar155) * fVar155 + fVar155;
                    fVar116 = (1.0 - local_1168._12_4_ * fVar116) * fVar116 + fVar116;
                    fVar100 = local_1178 * fVar72;
                    fVar154 = fStack_1174 * fVar114;
                    fVar62 = fStack_1170 * fVar155;
                    fVar159 = fStack_116c * fVar116;
                    local_1118[0] = fVar100;
                    local_1118[1] = fVar154;
                    local_1118[2] = fVar62;
                    local_1118[3] = fVar159;
                    local_1138[0] = (float)local_1198._0_4_ * fVar72;
                    local_1138[1] = (float)local_1198._4_4_ * fVar114;
                    local_1138[2] = fStack_1190 * fVar155;
                    local_1138[3] = fStack_118c * fVar116;
                    local_1128[0] = fVar146 * auVar128._0_4_ * fVar72;
                    local_1128[1] = fVar146 * auVar128._4_4_ * fVar114;
                    local_1128[2] = fVar146 * auVar128._8_4_ * fVar155;
                    local_1128[3] = fVar146 * auVar128._12_4_ * fVar116;
                    auVar123._0_8_ = CONCAT44(~auVar138._4_4_,~auVar138._0_4_) & 0x7f8000007f800000;
                    auVar123._8_4_ = ~auVar138._8_4_ & 0x7f800000;
                    auVar123._12_4_ = ~auVar138._12_4_ & 0x7f800000;
                    auVar19._4_4_ = (uint)fVar154 & auVar138._4_4_;
                    auVar19._0_4_ = (uint)fVar100 & auVar138._0_4_;
                    auVar19._8_4_ = (uint)fVar62 & auVar138._8_4_;
                    auVar19._12_4_ = (uint)fVar159 & auVar138._12_4_;
                    auVar123 = auVar123 | auVar19;
                    auVar129._4_4_ = auVar123._0_4_;
                    auVar129._0_4_ = auVar123._4_4_;
                    auVar129._8_4_ = auVar123._12_4_;
                    auVar129._12_4_ = auVar123._8_4_;
                    auVar74 = minps(auVar129,auVar123);
                    auVar110._0_8_ = auVar74._8_8_;
                    auVar110._8_4_ = auVar74._0_4_;
                    auVar110._12_4_ = auVar74._4_4_;
                    auVar74 = minps(auVar110,auVar74);
                    auVar111._0_8_ =
                         CONCAT44(-(uint)(auVar74._4_4_ == auVar123._4_4_) & auVar138._4_4_,
                                  -(uint)(auVar74._0_4_ == auVar123._0_4_) & auVar138._0_4_);
                    auVar111._8_4_ = -(uint)(auVar74._8_4_ == auVar123._8_4_) & auVar138._8_4_;
                    auVar111._12_4_ = -(uint)(auVar74._12_4_ == auVar123._12_4_) & auVar138._12_4_;
                    iVar44 = movmskps(fVar73,auVar111);
                    if (iVar44 != 0) {
                      auVar138._8_4_ = auVar111._8_4_;
                      auVar138._0_8_ = auVar111._0_8_;
                      auVar138._12_4_ = auVar111._12_4_;
                    }
                    uVar58 = movmskps(iVar44,auVar138);
                    lVar40 = 0;
                    if (uVar58 != 0) {
                      for (; (uVar58 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                      }
                    }
                    _fStack_1250 = auVar22._8_6_;
                    local_1258 = (undefined1  [8])local_1308->args;
                    fStack_124c._2_2_ = 0;
                    if ((local_1308->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar73 = local_1138[lVar40];
                      fVar100 = local_1128[lVar40];
                      fVar146 = *(float *)((long)&local_1108 + lVar40 * 4);
                      fVar154 = *(float *)(local_10f8 + lVar40 * 4);
                      fVar62 = *(float *)((long)&local_10e8 + lVar40 * 4);
                      *(float *)(local_1300 + 0x20) = local_1118[lVar40];
                      (((Vec3f *)(local_1300 + 0x30))->field_0).field_0.x = fVar146;
                      *(float *)(local_1300 + 0x34) = fVar154;
                      *(float *)(local_1300 + 0x38) = fVar62;
                      *(float *)(local_1300 + 0x3c) = fVar73;
                      *(float *)(local_1300 + 0x40) = fVar100;
                      *(float *)(local_1300 + 0x44) = fVar90;
                      *(float *)(local_1300 + 0x48) = fVar89;
                      pRVar57 = local_1308->user;
                      *(uint *)(local_1300 + 0x4c) = pRVar57->instID[0];
                      fVar73 = (float)pRVar57->instPrimID[0];
                      pSVar41 = (Scene *)(ulong)(uint)fVar73;
                      *(float *)(local_1300 + 0x50) = fVar73;
                    }
                    else {
                      local_12c8 = local_1308->user;
                      _local_12b8 = ZEXT416((uint)*(float *)(local_1300 + 0x20));
                      local_1208 = fVar100;
                      fStack_1204 = fVar154;
                      fStack_1200 = fVar62;
                      fStack_11fc = fVar159;
                      local_12d8 = pGVar49;
LAB_005a0a1a:
                      local_123c = local_1138[lVar40];
                      local_1238 = local_1128[lVar40];
                      (ray->super_RayK<1>).tfar = local_1118[lVar40];
                      local_1248 = *(float *)((long)&local_1108 + lVar40 * 4);
                      local_1244 = *(undefined4 *)(local_10f8 + lVar40 * 4);
                      local_1240 = *(undefined4 *)((long)&local_10e8 + lVar40 * 4);
                      local_1234 = (int)local_12e0;
                      local_1230 = (int)local_1334._4_8_;
                      local_122c = local_12c8->instID[0];
                      local_1228 = local_12c8->instPrimID[0];
                      local_1334._0_4_ = -NAN;
                      local_1288.valid = (int *)local_1334;
                      local_1288.geometryUserPtr = pGVar49->userPtr;
                      local_1288.context = local_12c8;
                      local_1288.ray = (RTCRayN *)ray;
                      local_1288.hit = (RTCHitN *)&local_1248;
                      local_1288.N = 1;
                      if ((pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar49->intersectionFilterN)(&local_1288), ray = (RayHit *)local_1300,
                         pGVar49 = local_12d8, fVar100 = local_1208, fVar154 = fStack_1204,
                         fVar62 = fStack_1200, fVar159 = fStack_11fc,
                         (((RayK<1> *)local_1288.valid)->org).field_0.m128[0] != 0.0)) {
                        if ((*(code **)((long)local_1258 + 0x10) != (code *)0x0) &&
                           ((((*(byte *)local_1258 & 2) != 0 ||
                             (((pGVar49->field_8).field_0x2 & 0x40) != 0)) &&
                            ((**(code **)((long)local_1258 + 0x10))(&local_1288),
                            ray = (RayHit *)local_1300, pGVar49 = local_12d8, fVar100 = local_1208,
                            fVar154 = fStack_1204, fVar62 = fStack_1200, fVar159 = fStack_11fc,
                            (((RayK<1> *)local_1288.valid)->org).field_0.m128[0] == 0.0))))
                        goto LAB_005a0be3;
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1288.hit;
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1288.hit + 4);
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1288.hit + 8);
                        *(float *)((long)local_1288.ray + 0x3c) = *(float *)(local_1288.hit + 0xc);
                        *(float *)((long)local_1288.ray + 0x40) = *(float *)(local_1288.hit + 0x10);
                        *(float *)((long)local_1288.ray + 0x44) = *(float *)(local_1288.hit + 0x14);
                        *(float *)((long)local_1288.ray + 0x48) = *(float *)(local_1288.hit + 0x18);
                        *(float *)((long)local_1288.ray + 0x4c) = *(float *)(local_1288.hit + 0x1c);
                        *(float *)((long)local_1288.ray + 0x50) = *(float *)(local_1288.hit + 0x20);
                        pRVar43 = (RayHit *)local_1288.ray;
                      }
                      else {
LAB_005a0be3:
                        *(undefined4 *)(local_1300 + 0x20) = local_12b8._0_4_;
                        pRVar43 = (RayHit *)local_1288.valid;
                        ray = (RayHit *)local_1300;
                        pGVar49 = local_12d8;
                        fVar100 = local_1208;
                        fVar154 = fStack_1204;
                        fVar62 = fStack_1200;
                        fVar159 = fStack_11fc;
                      }
                      *(undefined4 *)(local_1298 + lVar40 * 4) = 0;
                      fVar73 = (ray->super_RayK<1>).tfar;
                      auVar69._0_4_ = -(uint)(fVar100 <= fVar73) & local_1298._0_4_;
                      auVar69._4_4_ = -(uint)(fVar154 <= fVar73) & local_1298._4_4_;
                      auVar69._8_4_ = -(uint)(fVar62 <= fVar73) & local_1298._8_4_;
                      auVar69._12_4_ = -(uint)(fVar159 <= fVar73) & local_1298._12_4_;
                      local_1298 = auVar69;
                      uVar47 = (undefined4)((ulong)pRVar43 >> 0x20);
                      iVar44 = movmskps((int)pRVar43,auVar69);
                      pSVar41 = (Scene *)CONCAT44(uVar47,iVar44);
                      if (iVar44 != 0) {
                        auVar83._0_4_ = auVar69._0_4_ & (uint)fVar100;
                        auVar83._4_4_ = auVar69._4_4_ & (uint)fVar154;
                        auVar83._8_4_ = auVar69._8_4_ & (uint)fVar62;
                        auVar83._12_4_ = auVar69._12_4_ & (uint)fVar159;
                        auVar98._0_8_ = CONCAT44(~auVar69._4_4_,~auVar69._0_4_) & 0x7f8000007f800000
                        ;
                        auVar98._8_4_ = ~auVar69._8_4_ & 0x7f800000;
                        auVar98._12_4_ = ~auVar69._12_4_ & 0x7f800000;
                        auVar98 = auVar98 | auVar83;
                        auVar112._4_4_ = auVar98._0_4_;
                        auVar112._0_4_ = auVar98._4_4_;
                        auVar112._8_4_ = auVar98._12_4_;
                        auVar112._12_4_ = auVar98._8_4_;
                        auVar74 = minps(auVar112,auVar98);
                        auVar84._0_8_ = auVar74._8_8_;
                        auVar84._8_4_ = auVar74._0_4_;
                        auVar84._12_4_ = auVar74._4_4_;
                        auVar74 = minps(auVar84,auVar74);
                        auVar85._0_8_ =
                             CONCAT44(-(uint)(auVar74._4_4_ == auVar98._4_4_) & auVar69._4_4_,
                                      -(uint)(auVar74._0_4_ == auVar98._0_4_) & auVar69._0_4_);
                        auVar85._8_4_ = -(uint)(auVar74._8_4_ == auVar98._8_4_) & auVar69._8_4_;
                        auVar85._12_4_ = -(uint)(auVar74._12_4_ == auVar98._12_4_) & auVar69._12_4_;
                        iVar44 = movmskps(iVar44,auVar85);
                        if (iVar44 != 0) {
                          auVar69._8_4_ = auVar85._8_4_;
                          auVar69._0_8_ = auVar85._0_8_;
                          auVar69._12_4_ = auVar85._12_4_;
                        }
                        local_12b8._0_4_ = (ray->super_RayK<1>).tfar;
                        local_12b8._4_4_ = (ray->super_RayK<1>).mask;
                        fStack_12b0 = (float)(ray->super_RayK<1>).id;
                        fStack_12ac = (float)(ray->super_RayK<1>).flags;
                        uVar38 = movmskps(iVar44,auVar69);
                        uVar42 = CONCAT44(uVar47,uVar38);
                        lVar40 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                          }
                        }
                        goto LAB_005a0a1a;
                      }
                      fVar101 = (ray->super_RayK<1>).org.field_0.m128[0];
                      local_12c8._4_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
                      fVar115 = (ray->super_RayK<1>).org.field_0.m128[2];
                      fVar170 = (ray->super_RayK<1>).dir.field_0.m128[0];
                      local_1208 = (ray->super_RayK<1>).dir.field_0.m128[1];
                      local_12b8._4_4_ =
                           *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
                      fStack_1204 = local_1208;
                      fStack_1200 = local_1208;
                      fStack_11fc = local_1208;
                      local_12b8._0_4_ = local_12b8._4_4_;
                      fStack_12b0 = (float)local_12b8._4_4_;
                      fStack_12ac = (float)local_12b8._4_4_;
                    }
                    fVar154 = (float)local_11b8;
                    fVar100 = local_11b8._4_4_;
                    local_1258._0_4_ = (float)local_11d8;
                    fVar62 = local_11d8._4_4_;
                  }
                }
              }
              local_1258._0_4_ = (float)local_12f8 - (float)local_1258._0_4_;
              local_1258._4_4_ = local_12f8._4_4_ - fVar62;
              fStack_1250 = fStack_12f0 - fStack_11d0;
              fStack_124c = fStack_12ec - fStack_11cc;
              fVar116 = local_1218 - local_11c8;
              fVar131 = fStack_1214 - fStack_11c4;
              fVar133 = fStack_1210 - fStack_11c0;
              fVar134 = fStack_120c - fStack_11bc;
              fVar154 = (float)local_1328 - fVar154;
              fVar100 = (float)auStack_1324._0_4_ - fVar100;
              fVar143 = (float)auStack_1324._4_4_ - fStack_11b0;
              fVar144 = fStack_131c - fStack_11ac;
              local_1318._0_4_ = (float)(undefined4)local_1318 - (float)local_12f8;
              local_1318._4_4_ = local_1318._4_4_ - local_12f8._4_4_;
              fStack_1310 = fStack_1310 - fStack_12f0;
              fStack_130c = fStack_130c - fStack_12ec;
              fVar135 = local_11a8 - local_1218;
              fVar136 = fStack_11a4 - fStack_1214;
              fVar137 = fStack_11a0 - fStack_1210;
              fVar141 = fStack_119c - fStack_120c;
              fVar73 = (float)local_12a8._0_4_ - (float)local_1328;
              fVar89 = (float)local_12a8._4_4_ - (float)auStack_1324._0_4_;
              fVar90 = (float)uStack_12a0 - (float)auStack_1324._4_4_;
              fVar146 = uStack_12a0._4_4_ - fStack_131c;
              local_12a8._0_4_ = fVar135 * fVar154 - fVar73 * fVar116;
              local_12a8._4_4_ = fVar136 * fVar100 - fVar89 * fVar131;
              uStack_12a0._0_4_ = fVar137 * fVar143 - fVar90 * fVar133;
              uStack_12a0._4_4_ = fVar141 * fVar144 - fVar146 * fVar134;
              local_11a8 = fVar73 * (float)local_1258._0_4_ -
                           (float)(undefined4)local_1318 * fVar154;
              fStack_11a4 = fVar89 * (float)local_1258._4_4_ - local_1318._4_4_ * fVar100;
              fStack_11a0 = fVar90 * fStack_1250 - fStack_1310 * fVar143;
              fStack_119c = fVar146 * fStack_124c - fStack_130c * fVar144;
              fVar142 = (float)(undefined4)local_1318 * fVar116 - fVar135 * (float)local_1258._0_4_;
              fVar157 = local_1318._4_4_ * fVar131 - fVar136 * (float)local_1258._4_4_;
              fStack_12c0 = fStack_1310 * fVar133 - fVar137 * fStack_1250;
              fStack_12bc = fStack_130c * fVar134 - fVar141 * fStack_124c;
              local_12f8._0_4_ = (float)local_12f8 - fVar101;
              local_12f8._4_4_ = local_12f8._4_4_ - fVar101;
              fStack_12f0 = fStack_12f0 - fVar101;
              fStack_12ec = fStack_12ec - fVar101;
              fVar150 = local_1218 - local_12c8._4_4_;
              fVar151 = fStack_1214 - local_12c8._4_4_;
              fVar153 = fStack_1210 - local_12c8._4_4_;
              fVar156 = fStack_120c - local_12c8._4_4_;
              local_1328 = (undefined1  [4])((float)local_1328 - fVar115);
              auStack_1324._0_4_ = (float)auStack_1324._0_4_ - fVar115;
              auStack_1324._4_4_ = (float)auStack_1324._4_4_ - fVar115;
              fStack_131c = fStack_131c - fVar115;
              fVar101 = fVar150 * (float)local_12b8._0_4_ - (float)local_1328 * fStack_11fc;
              fVar115 = fVar151 * (float)local_12b8._4_4_ - (float)auStack_1324._0_4_ * fStack_11fc;
              fVar62 = fVar153 * fStack_12b0 - (float)auStack_1324._4_4_ * fStack_11fc;
              fVar159 = fVar156 * fStack_12ac - fStack_131c * fStack_11fc;
              fVar145 = (float)local_1328 * fVar170 - (float)local_12f8 * (float)local_12b8._0_4_;
              fVar147 = (float)auStack_1324._0_4_ * fVar170 -
                        local_12f8._4_4_ * (float)local_12b8._4_4_;
              fVar148 = (float)auStack_1324._4_4_ * fVar170 - fStack_12f0 * fStack_12b0;
              fVar149 = fStack_131c * fVar170 - fStack_12ec * fStack_12ac;
              fVar71 = (float)local_12f8 * fStack_11fc - fVar150 * fVar170;
              fVar72 = local_12f8._4_4_ * fStack_11fc - fVar151 * fVar170;
              fVar114 = fStack_12f0 * fStack_11fc - fVar153 * fVar170;
              fVar155 = fStack_12ec * fStack_11fc - fVar156 * fVar170;
              local_12c8 = (RTCRayQueryContext *)CONCAT44(fVar157,fVar142);
              fVar158 = fVar170 * (float)local_12a8._0_4_ +
                        fStack_11fc * local_11a8 + (float)local_12b8._0_4_ * fVar142;
              fVar160 = fVar170 * (float)local_12a8._4_4_ +
                        fStack_11fc * fStack_11a4 + (float)local_12b8._4_4_ * fVar157;
              fVar161 = fVar170 * (float)uStack_12a0 +
                        fStack_11fc * fStack_11a0 + fStack_12b0 * fStack_12c0;
              fVar162 = fVar170 * uStack_12a0._4_4_ +
                        fStack_11fc * fStack_119c + fStack_12ac * fStack_12bc;
              uVar58 = (uint)fVar158 & 0x80000000;
              uVar59 = (uint)fVar160 & 0x80000000;
              uVar60 = (uint)fVar161 & 0x80000000;
              uVar61 = (uint)fVar162 & 0x80000000;
              fVar170 = (float)((uint)((float)(undefined4)local_1318 * fVar101 +
                                      fVar135 * fVar145 + fVar73 * fVar71) ^ uVar58);
              fVar152 = (float)((uint)(local_1318._4_4_ * fVar115 +
                                      fVar136 * fVar147 + fVar89 * fVar72) ^ uVar59);
              fVar137 = (float)((uint)(fStack_1310 * fVar62 + fVar137 * fVar148 + fVar90 * fVar114)
                               ^ uVar60);
              fVar141 = (float)((uint)(fStack_130c * fVar159 + fVar141 * fVar149 + fVar146 * fVar155
                                      ) ^ uVar61);
              fVar90 = (float)((uint)(fVar101 * (float)local_1258._0_4_ +
                                     fVar145 * fVar116 + fVar71 * fVar154) ^ uVar58);
              fVar100 = (float)((uint)(fVar115 * (float)local_1258._4_4_ +
                                      fVar147 * fVar131 + fVar72 * fVar100) ^ uVar59);
              fVar146 = (float)((uint)(fVar62 * fStack_1250 + fVar148 * fVar133 + fVar114 * fVar143)
                               ^ uVar60);
              fVar154 = (float)((uint)(fVar159 * fStack_124c + fVar149 * fVar134 + fVar155 * fVar144
                                      ) ^ uVar61);
              fVar73 = ABS(fVar158);
              fVar89 = ABS(fVar160);
              local_1168._0_8_ = CONCAT44(fVar160,fVar158) & 0x7fffffff7fffffff;
              local_1168._8_4_ = ABS(fVar161);
              local_1168._12_4_ = ABS(fVar162);
              auVar119._0_4_ =
                   -(uint)((0.0 <= fVar170 && 0.0 <= fVar90) && fVar158 != 0.0) & local_1048 &
                   -(uint)(fVar170 + fVar90 <= fVar73);
              auVar119._4_4_ =
                   -(uint)((0.0 <= fVar152 && 0.0 <= fVar100) && fVar160 != 0.0) & uStack_1044 &
                   -(uint)(fVar152 + fVar100 <= fVar89);
              auVar119._8_4_ =
                   -(uint)((0.0 <= fVar137 && 0.0 <= fVar146) && fVar161 != 0.0) & uStack_1040 &
                   -(uint)(fVar137 + fVar146 <= local_1168._8_4_);
              auVar119._12_4_ =
                   -(uint)((0.0 <= fVar141 && 0.0 <= fVar154) && fVar162 != 0.0) & uStack_103c &
                   -(uint)(fVar141 + fVar154 <= local_1168._12_4_);
              iVar44 = movmskps((int)pSVar41,auVar119);
              fVar159 = local_1058;
              fVar71 = fStack_1054;
              fVar72 = fStack_1050;
              fVar114 = fStack_104c;
              fVar62 = local_f98;
              fVar134 = fStack_f94;
              fVar135 = fStack_f90;
              fVar136 = fStack_f8c;
              if (iVar44 != 0) {
                local_1178 = (float)(uVar58 ^ (uint)((float)local_12f8 * (float)local_12a8._0_4_ +
                                                    fVar150 * local_11a8 +
                                                    (float)local_1328 * fVar142));
                fStack_1174 = (float)(uVar59 ^ (uint)(local_12f8._4_4_ * (float)local_12a8._4_4_ +
                                                     fVar151 * fStack_11a4 +
                                                     (float)auStack_1324._0_4_ * fVar157));
                fStack_1170 = (float)(uVar60 ^ (uint)(fStack_12f0 * (float)uStack_12a0 +
                                                     fVar153 * fStack_11a0 +
                                                     (float)auStack_1324._4_4_ * fStack_12c0));
                fStack_116c = (float)(uVar61 ^ (uint)(fStack_12ec * uStack_12a0._4_4_ +
                                                     fVar156 * fStack_119c +
                                                     fStack_131c * fStack_12bc));
                fVar101 = (ray->super_RayK<1>).org.field_0.m128[3];
                fVar115 = (ray->super_RayK<1>).tfar;
                uVar58 = (ray->super_RayK<1>).mask;
                auVar68._0_4_ =
                     -(uint)(local_1178 <= fVar115 * fVar73 && fVar101 * fVar73 < local_1178) &
                     auVar119._0_4_;
                auVar68._4_4_ =
                     -(uint)(fStack_1174 <= fVar115 * fVar89 && fVar101 * fVar89 < fStack_1174) &
                     auVar119._4_4_;
                auVar68._8_4_ =
                     -(uint)(fStack_1170 <= fVar115 * local_1168._8_4_ &&
                            fVar101 * local_1168._8_4_ < fStack_1170) & auVar119._8_4_;
                auVar68._12_4_ =
                     -(uint)(fStack_116c <= fVar115 * local_1168._12_4_ &&
                            fVar101 * local_1168._12_4_ < fStack_116c) & auVar119._12_4_;
                iVar44 = movmskps(iVar44,auVar68);
                if (iVar44 != 0) {
                  auVar120._4_4_ = uVar58;
                  auVar120._0_4_ = uVar58;
                  auVar120._8_4_ = uVar58;
                  auVar120._12_4_ = uVar58;
                  local_1148 = auVar68;
                  local_1108 = local_12a8;
                  uStack_1100 = uStack_12a0;
                  local_10f8._4_4_ = fStack_11a4;
                  local_10f8._0_4_ = local_11a8;
                  local_10f8._12_4_ = fStack_119c;
                  local_10f8._8_4_ = fStack_11a0;
                  local_10e8 = local_12c8;
                  uStack_10e0 = CONCAT44(fStack_12bc,fStack_12c0);
                  auVar127._0_4_ = fVar73 - fVar90;
                  auVar127._4_4_ = fVar89 - fVar100;
                  auVar127._8_4_ = local_1168._8_4_ - fVar146;
                  auVar127._12_4_ = local_1168._12_4_ - fVar154;
                  auVar121._4_12_ = auVar120._4_12_;
                  auVar121._0_4_ = (float)(int)(*(ushort *)(local_11f0 + 8 + lVar55) - 1);
                  auVar139._4_4_ = uVar58;
                  auVar139._0_4_ = auVar121._0_4_;
                  auVar139._8_4_ = uVar58;
                  auVar139._12_4_ = uVar58;
                  auVar74 = rcpss(auVar139,auVar121);
                  fVar100 = (float)(int)(*(ushort *)(local_11f0 + 10 + lVar55) - 1);
                  fVar90 = (2.0 - auVar121._0_4_ * auVar74._0_4_) * auVar74._0_4_;
                  auVar140._4_4_ = fVar157;
                  auVar140._0_4_ = fVar100;
                  auVar140._8_4_ = fStack_12c0;
                  auVar140._12_4_ = fStack_12bc;
                  auVar14._4_4_ = fVar157;
                  auVar14._0_4_ = fVar100;
                  auVar14._8_4_ = fStack_12c0;
                  auVar14._12_4_ = fStack_12bc;
                  auVar74 = rcpss(auVar140,auVar14);
                  fVar100 = (2.0 - fVar100 * auVar74._0_4_) * auVar74._0_4_;
                  local_1198._0_4_ = fVar90 * ((float)(int)local_fe8 * fVar73 + (fVar73 - fVar170));
                  local_1198._4_4_ =
                       fVar90 * ((float)(int)(uStack_fe4 + 1) * fVar89 + (fVar89 - fVar152));
                  fStack_1190 = fVar90 * ((float)(int)(uStack_fe0 + 1) * local_1168._8_4_ +
                                         (local_1168._8_4_ - fVar137));
                  fStack_118c = fVar90 * ((float)(int)uStack_fdc * local_1168._12_4_ +
                                         (local_1168._12_4_ - fVar141));
                  local_1188._0_4_ = fVar100 * ((float)local_fd8 * fVar73 + auVar127._0_4_);
                  local_1188._4_4_ = fVar100 * ((float)iStack_fd4 * fVar89 + auVar127._4_4_);
                  fStack_1180 = fVar100 * ((float)(iStack_fd0 + 1) * local_1168._8_4_ +
                                          auVar127._8_4_);
                  fStack_117c = fVar100 * ((float)(iStack_fcc + 1) * local_1168._12_4_ +
                                          auVar127._12_4_);
                  pGVar49 = (local_1308->scene->geometries).items[local_1334._4_8_].ptr;
                  if ((pGVar49->mask & uVar58) != 0) {
                    local_1298 = auVar68;
                    auVar74 = rcpps(auVar127,local_1168);
                    fVar90 = auVar74._0_4_;
                    fVar100 = auVar74._4_4_;
                    fVar146 = auVar74._8_4_;
                    fVar154 = auVar74._12_4_;
                    fVar90 = (1.0 - fVar73 * fVar90) * fVar90 + fVar90;
                    fVar100 = (1.0 - fVar89 * fVar100) * fVar100 + fVar100;
                    fVar146 = (1.0 - local_1168._8_4_ * fVar146) * fVar146 + fVar146;
                    fVar154 = (1.0 - local_1168._12_4_ * fVar154) * fVar154 + fVar154;
                    local_1118[0] = local_1178 * fVar90;
                    local_1118[1] = fStack_1174 * fVar100;
                    local_1118[2] = fStack_1170 * fVar146;
                    local_1118[3] = fStack_116c * fVar154;
                    local_1138[0] = (float)local_1198._0_4_ * fVar90;
                    local_1138[1] = (float)local_1198._4_4_ * fVar100;
                    local_1138[2] = fStack_1190 * fVar146;
                    local_1138[3] = fStack_118c * fVar154;
                    local_1128[0] = (float)local_1188._0_4_ * fVar90;
                    local_1128[1] = (float)local_1188._4_4_ * fVar100;
                    local_1128[2] = fStack_1180 * fVar146;
                    local_1128[3] = fStack_117c * fVar154;
                    auVar97._0_8_ = CONCAT44(~auVar68._4_4_,~auVar68._0_4_) & 0x7f8000007f800000;
                    auVar97._8_4_ = ~auVar68._8_4_ & 0x7f800000;
                    auVar97._12_4_ = ~auVar68._12_4_ & 0x7f800000;
                    auVar17._4_4_ = (uint)local_1118[1] & auVar68._4_4_;
                    auVar17._0_4_ = (uint)local_1118[0] & auVar68._0_4_;
                    auVar17._8_4_ = (uint)local_1118[2] & auVar68._8_4_;
                    auVar17._12_4_ = (uint)local_1118[3] & auVar68._12_4_;
                    auVar97 = auVar97 | auVar17;
                    auVar109._4_4_ = auVar97._0_4_;
                    auVar109._0_4_ = auVar97._4_4_;
                    auVar109._8_4_ = auVar97._12_4_;
                    auVar109._12_4_ = auVar97._8_4_;
                    auVar74 = minps(auVar109,auVar97);
                    auVar81._0_8_ = auVar74._8_8_;
                    auVar81._8_4_ = auVar74._0_4_;
                    auVar81._12_4_ = auVar74._4_4_;
                    auVar74 = minps(auVar81,auVar74);
                    auVar82._0_8_ =
                         CONCAT44(-(uint)(auVar74._4_4_ == auVar97._4_4_) & auVar68._4_4_,
                                  -(uint)(auVar74._0_4_ == auVar97._0_4_) & auVar68._0_4_);
                    auVar82._8_4_ = -(uint)(auVar74._8_4_ == auVar97._8_4_) & auVar68._8_4_;
                    auVar82._12_4_ = -(uint)(auVar74._12_4_ == auVar97._12_4_) & auVar68._12_4_;
                    iVar44 = movmskps(uVar58,auVar82);
                    if (iVar44 != 0) {
                      auVar68._8_4_ = auVar82._8_4_;
                      auVar68._0_8_ = auVar82._0_8_;
                      auVar68._12_4_ = auVar82._12_4_;
                    }
                    uVar58 = movmskps(iVar44,auVar68);
                    lVar40 = 0;
                    if (uVar58 != 0) {
                      for (; (uVar58 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                      }
                    }
                    local_1318 = local_1308->args;
                    if (local_1308->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar57 = local_1308->user;
                      if (pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar73 = local_1138[lVar40];
                        fVar89 = local_1128[lVar40];
                        fVar90 = *(float *)((long)&local_1108 + lVar40 * 4);
                        fVar100 = *(float *)(local_10f8 + lVar40 * 4);
                        fVar146 = *(float *)((long)&local_10e8 + lVar40 * 4);
                        (ray->super_RayK<1>).tfar = local_1118[lVar40];
                        (ray->Ng).field_0.field_0.x = fVar90;
                        (ray->Ng).field_0.field_0.y = fVar100;
                        (ray->Ng).field_0.field_0.z = fVar146;
                        ray->u = fVar73;
                        ray->v = fVar89;
                        ray->primID = (uint)local_12e0;
                        ray->geomID = (uint)local_1334._4_8_;
                        ray->instID[0] = pRVar57->instID[0];
                        ray->instPrimID[0] = pRVar57->instPrimID[0];
                        goto LAB_0059fdfb;
                      }
                    }
                    else {
                      pRVar57 = local_1308->user;
                    }
                    uVar35 = (ray->super_RayK<1>).tfar;
                    uVar36 = (ray->super_RayK<1>).mask;
                    uVar37 = (ray->super_RayK<1>).id;
                    auStack_1324._4_4_ = uVar37;
                    auStack_1324._0_4_ = uVar36;
                    local_1328 = (undefined1  [4])uVar35;
                    fStack_131c = (float)(ray->super_RayK<1>).flags;
                    auVar130._4_4_ = local_1118[1];
                    auVar130._0_4_ = local_1118[0];
                    auVar130._8_4_ = local_1118[2];
                    auVar130._12_4_ = local_1118[3];
                    local_12f8 = pGVar49;
                    _local_12a8 = auVar130;
                    local_1208 = fStack_11fc;
                    fStack_1204 = fStack_11fc;
                    fStack_1200 = fStack_11fc;
                    while( true ) {
                      local_123c = local_1138[lVar40];
                      local_1238 = local_1128[lVar40];
                      (ray->super_RayK<1>).tfar = local_1118[lVar40];
                      local_1248 = *(float *)((long)&local_1108 + lVar40 * 4);
                      local_1244 = *(undefined4 *)(local_10f8 + lVar40 * 4);
                      local_1240 = *(undefined4 *)((long)&local_10e8 + lVar40 * 4);
                      local_1234 = (int)local_12e0;
                      local_1230 = (int)local_1334._4_8_;
                      local_122c = pRVar57->instID[0];
                      local_1228 = pRVar57->instPrimID[0];
                      local_1334._0_4_ = -NAN;
                      local_1288.valid = (int *)local_1334;
                      local_1288.geometryUserPtr = pGVar49->userPtr;
                      local_1288.context = pRVar57;
                      local_1288.ray = (RTCRayN *)ray;
                      local_1288.hit = (RTCHitN *)&local_1248;
                      local_1288.N = 1;
                      if (((pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                          ((*pGVar49->intersectionFilterN)(&local_1288), ray = (RayHit *)local_1300,
                          pGVar49 = local_12f8, auVar130 = _local_12a8,
                          (((RayK<1> *)local_1288.valid)->org).field_0.m128[0] != 0.0)) &&
                         (((local_1318->filter == (RTCFilterFunctionN)0x0 ||
                           (((local_1318->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                             RTC_RAY_QUERY_FLAG_INCOHERENT &&
                            (((pGVar49->field_8).field_0x2 & 0x40) == 0)))) ||
                          ((*local_1318->filter)(&local_1288), ray = (RayHit *)local_1300,
                          pGVar49 = local_12f8, auVar130 = _local_12a8,
                          (((RayK<1> *)local_1288.valid)->org).field_0.m128[0] != 0.0)))) {
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1288.hit;
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1288.hit + 4);
                        (((Vec3f *)((long)local_1288.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1288.hit + 8);
                        *(float *)((long)local_1288.ray + 0x3c) = *(float *)(local_1288.hit + 0xc);
                        *(float *)((long)local_1288.ray + 0x40) = *(float *)(local_1288.hit + 0x10);
                        *(float *)((long)local_1288.ray + 0x44) = *(float *)(local_1288.hit + 0x14);
                        *(float *)((long)local_1288.ray + 0x48) = *(float *)(local_1288.hit + 0x18);
                        *(float *)((long)local_1288.ray + 0x4c) = *(float *)(local_1288.hit + 0x1c);
                        *(float *)((long)local_1288.ray + 0x50) = *(float *)(local_1288.hit + 0x20);
                        pRVar43 = (RayHit *)local_1288.ray;
                      }
                      else {
                        *(undefined1 (*) [4])(local_1300 + 0x20) = local_1328;
                        pRVar43 = (RayHit *)local_1288.valid;
                        ray = (RayHit *)local_1300;
                        pGVar49 = local_12f8;
                        auVar130 = _local_12a8;
                      }
                      *(undefined4 *)(local_1298 + lVar40 * 4) = 0;
                      local_1328 = (undefined1  [4])(ray->super_RayK<1>).tfar;
                      auStack_1324._0_4_ = (ray->super_RayK<1>).mask;
                      auStack_1324._4_4_ = (ray->super_RayK<1>).id;
                      fStack_131c = (float)(ray->super_RayK<1>).flags;
                      auVar70._0_4_ =
                           -(uint)(auVar130._0_4_ <= (float)local_1328) & local_1298._0_4_;
                      auVar70._4_4_ =
                           -(uint)(auVar130._4_4_ <= (float)local_1328) & local_1298._4_4_;
                      auVar70._8_4_ =
                           -(uint)(auVar130._8_4_ <= (float)local_1328) & local_1298._8_4_;
                      auVar70._12_4_ =
                           -(uint)(auVar130._12_4_ <= (float)local_1328) & local_1298._12_4_;
                      local_1298 = auVar70;
                      iVar44 = movmskps((int)pRVar43,auVar70);
                      fVar159 = local_1058;
                      fVar71 = fStack_1054;
                      fVar72 = fStack_1050;
                      fVar114 = fStack_104c;
                      fVar62 = local_f98;
                      fVar134 = fStack_f94;
                      fVar135 = fStack_f90;
                      fVar136 = fStack_f8c;
                      if (iVar44 == 0) break;
                      auVar86._0_4_ = auVar70._0_4_ & (uint)auVar130._0_4_;
                      auVar86._4_4_ = auVar70._4_4_ & (uint)auVar130._4_4_;
                      auVar86._8_4_ = auVar70._8_4_ & (uint)auVar130._8_4_;
                      auVar86._12_4_ = auVar70._12_4_ & (uint)auVar130._12_4_;
                      auVar99._0_8_ = CONCAT44(~auVar70._4_4_,~auVar70._0_4_) & 0x7f8000007f800000;
                      auVar99._8_4_ = ~auVar70._8_4_ & 0x7f800000;
                      auVar99._12_4_ = ~auVar70._12_4_ & 0x7f800000;
                      auVar99 = auVar99 | auVar86;
                      auVar113._4_4_ = auVar99._0_4_;
                      auVar113._0_4_ = auVar99._4_4_;
                      auVar113._8_4_ = auVar99._12_4_;
                      auVar113._12_4_ = auVar99._8_4_;
                      auVar74 = minps(auVar113,auVar99);
                      auVar87._0_8_ = auVar74._8_8_;
                      auVar87._8_4_ = auVar74._0_4_;
                      auVar87._12_4_ = auVar74._4_4_;
                      auVar74 = minps(auVar87,auVar74);
                      auVar88._0_8_ =
                           CONCAT44(-(uint)(auVar74._4_4_ == auVar99._4_4_) & auVar70._4_4_,
                                    -(uint)(auVar74._0_4_ == auVar99._0_4_) & auVar70._0_4_);
                      auVar88._8_4_ = -(uint)(auVar74._8_4_ == auVar99._8_4_) & auVar70._8_4_;
                      auVar88._12_4_ = -(uint)(auVar74._12_4_ == auVar99._12_4_) & auVar70._12_4_;
                      iVar44 = movmskps(iVar44,auVar88);
                      if (iVar44 != 0) {
                        auVar70._8_4_ = auVar88._8_4_;
                        auVar70._0_8_ = auVar88._0_8_;
                        auVar70._12_4_ = auVar88._12_4_;
                      }
                      uVar47 = movmskps(iVar44,auVar70);
                      uVar42 = CONCAT44((int)((ulong)pRVar43 >> 0x20),uVar47);
                      lVar40 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0059fdfb;
          }
          uVar48 = local_10a0;
          uVar42 = local_1080;
          uVar53 = local_1098;
          uVar54 = local_1088;
          uVar56 = local_1090;
          auVar74 = local_1068;
          fVar89 = local_1008;
          fVar73 = fStack_1004;
          fVar146 = fStack_1000;
          fVar154 = fStack_ffc;
          fVar90 = local_1018;
          fVar101 = fStack_1014;
          fVar115 = fStack_1010;
          fVar170 = fStack_100c;
          fVar155 = local_1028;
          fVar116 = fStack_1024;
          fVar131 = fStack_1020;
          fVar133 = fStack_101c;
          fVar157 = local_1038;
          fVar137 = fStack_1034;
          fVar141 = fStack_1030;
          fVar142 = fStack_102c;
          fVar100 = local_ff8;
          fVar143 = fStack_ff4;
          fVar144 = fStack_ff0;
          fVar145 = fStack_fec;
        }
        fVar62 = (ray->super_RayK<1>).tfar;
        fVar134 = fVar62;
        fVar135 = fVar62;
        fVar136 = fVar62;
      }
      goto LAB_0059f8d0;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }